

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DOMParentNode.cpp
# Opt level: O0

void __thiscall
xercesc_4_0::DOMParentNode::DOMParentNode
          (DOMParentNode *this,DOMNode *containingNode,DOMParentNode *other)

{
  DOMException *this_00;
  DOMDocument *pDVar1;
  MemoryManager *local_80;
  DOMDocumentImpl *local_70;
  DOMNode *local_60;
  MemoryManager *local_50;
  DOMParentNode *other_local;
  DOMNode *containingNode_local;
  DOMParentNode *this_local;
  
  this->_vptr_DOMParentNode = (_func_int **)&PTR_appendChildFast_0052bc48;
  this->fContainingNode = containingNode;
  DOMNodeListImpl::DOMNodeListImpl(&this->fChildNodeList,this);
  if (this->fContainingNode == (DOMNode *)0x0) {
    this_00 = (DOMException *)__cxa_allocate_exception(0x28);
    if (this == (DOMParentNode *)0x0) {
      local_50 = XMLPlatformUtils::fgMemoryManager;
    }
    else {
      pDVar1 = getOwnerDocument(this);
      if (pDVar1 == (DOMDocument *)0x0) {
        local_60 = (DOMNode *)0x0;
      }
      else {
        local_60 = &pDVar1[-1].super_DOMNode;
      }
      if (local_60 == (DOMNode *)0x0) {
        local_80 = XMLPlatformUtils::fgMemoryManager;
      }
      else {
        pDVar1 = getOwnerDocument(this);
        if (pDVar1 == (DOMDocument *)0x0) {
          local_70 = (DOMDocumentImpl *)0x0;
        }
        else {
          local_70 = (DOMDocumentImpl *)&pDVar1[-1].super_DOMNode;
        }
        local_80 = DOMDocumentImpl::getMemoryManager(local_70);
      }
      local_50 = local_80;
    }
    DOMException::DOMException(this_00,0xb,0,local_50);
    __cxa_throw(this_00,&DOMException::typeinfo,DOMException::~DOMException);
  }
  this->fOwnerDocument = other->fOwnerDocument;
  this->fFirstChild = (DOMNode *)0x0;
  return;
}

Assistant:

DOMParentNode::DOMParentNode(DOMNode* containingNode, const DOMParentNode &other)  :
    fContainingNode(containingNode), fChildNodeList(this)
{
    if (!fContainingNode) {
        throw DOMException(DOMException::INVALID_STATE_ERR, 0, GetDOMNodeMemoryManager);
    }

    this->fOwnerDocument = other.fOwnerDocument;

    // Need to break the association w/ original kids
    this->fFirstChild = 0;
}